

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

void __thiscall glcts::TestCaseBase::checkFramebufferStatus(TestCaseBase *this,GLenum framebuffer)

{
  int iVar1;
  undefined4 uVar2;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  uVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x170))(framebuffer);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"Error getting framebuffer status!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x3cb);
  switch(uVar2) {
  case 0x8cd5:
    return;
  case 0x8cd6:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Framebuffer incomplete, status: GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
               ,0x3d3);
    break;
  case 0x8cd7:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "Framebuffer incomplete, status: GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
               ,0x3dd);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Framebuffer incomplete, status not recognized",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
               ,999);
    break;
  case 0x8cd9:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Framebuffer incomplete, status: GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
               ,0x3d8);
    break;
  case 0x8cdd:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Framebuffer incomplete, status: Error: GL_FRAMEBUFFER_UNSUPPORTED",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
               ,0x3e2);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TestCaseBase::checkFramebufferStatus(glw::GLenum framebuffer) const
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum framebuffer_status = gl.checkFramebufferStatus(framebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting framebuffer status!");

	if (GL_FRAMEBUFFER_COMPLETE != framebuffer_status)
	{
		switch (framebuffer_status)
		{
		case GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT:
		{
			TCU_FAIL("Framebuffer incomplete, status: GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT");
		}

		case GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS:
		{
			TCU_FAIL("Framebuffer incomplete, status: GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS");
		}

		case GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT:
		{
			TCU_FAIL("Framebuffer incomplete, status: GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT");
		}

		case GL_FRAMEBUFFER_UNSUPPORTED:
		{
			TCU_FAIL("Framebuffer incomplete, status: Error: GL_FRAMEBUFFER_UNSUPPORTED");
		}

		default:
		{
			TCU_FAIL("Framebuffer incomplete, status not recognized");
		}
		} /* switch (framebuffer_status) */
	}	 /* if (GL_FRAMEBUFFER_COMPLETE != framebuffer_status) */
}